

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void __thiscall
crnlib::vector<crnlib::vector<crnlib::mip_level_*>_>::resize
          (vector<crnlib::vector<crnlib::mip_level_*>_> *this,uint new_size,bool grow_hint)

{
  uint uVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  void *p;
  long lVar3;
  uint uVar4;
  
  uVar1 = this->m_size;
  uVar4 = uVar1 - new_size;
  if (uVar4 != 0) {
    if (uVar1 < new_size || uVar4 == 0) {
      if (this->m_capacity < new_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this,new_size,uVar1 + 1 == new_size || grow_hint,0x10,
                   (object_mover)0x0,false);
      }
      uVar1 = this->m_size;
      if (new_size != uVar1) {
        memset(this->m_p + uVar1,0,(ulong)(new_size - uVar1) << 4);
      }
    }
    else {
      pvVar2 = this->m_p;
      lVar3 = 0;
      do {
        p = *(void **)((long)&pvVar2[new_size].m_p + lVar3);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar3 = lVar3 + 0x10;
      } while ((ulong)uVar4 << 4 != lVar3);
    }
    this->m_size = new_size;
  }
  return;
}

Assistant:

inline void resize(uint new_size, bool grow_hint = false)
        {
            if (m_size != new_size) {
                if (new_size < m_size)
                {
                    scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
                }
                else
                {
                    if (new_size > m_capacity)
                    {
                        increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint);
                    }

                    scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
                }

                m_size = new_size;
            }
        }